

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O2

int32_t icu_63::CollationFastLatin::compareUTF8
                  (uint16_t *table,uint16_t *primaries,int32_t options,uint8_t *left,
                  int32_t leftLength,uint8_t *right,int32_t rightLength)

{
  uint16_t *table_00;
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int32_t iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  uint variableTop;
  uint32_t uVar12;
  bool bVar13;
  bool bVar14;
  int32_t rightIndex;
  int32_t leftIndex;
  int32_t leftLength_local;
  uint local_4c;
  uint8_t *local_48;
  uint local_3c;
  uint16_t *local_38;
  
  table_00 = table + (byte)*table;
  leftIndex = 0;
  rightIndex = 0;
  variableTop = (uint)options >> 0x10;
  local_3c = options & 0xffff;
  uVar4 = 0;
  uVar3 = 0;
  leftLength_local = leftLength;
  local_4c = options;
  local_48 = right;
  local_38 = primaries;
LAB_0023536d:
  do {
    if (uVar3 == 0) {
      if (leftIndex == leftLength_local) {
        uVar3 = 2;
      }
      else {
        lVar11 = (long)leftIndex + 1;
        iVar10 = (int)lVar11;
        bVar1 = left[leftIndex];
        lVar9 = (long)(char)bVar1;
        uVar6 = (uint)bVar1;
        if (lVar9 < 0) {
          if ((((byte)(bVar1 + 0x3a) < 0xfc) || (iVar10 == leftLength_local)) ||
             (-0x41 < (char)left[lVar11])) {
            leftIndex = iVar10;
            uVar2 = lookupUTF8(table_00,(uint)bVar1,left,&leftIndex,leftLength_local);
          }
          else {
            leftIndex = leftIndex + 2;
            uVar6 = ((uint)bVar1 * 0x40 + (uint)left[lVar11]) - 0x3080;
            uVar3 = (uint)local_38[uVar6];
            if (local_38[uVar6] != 0) goto LAB_00235478;
            uVar2 = (uint32_t)table_00[uVar6];
          }
        }
        else {
          uVar3 = (uint)local_38[lVar9];
          leftIndex = iVar10;
          if (local_38[lVar9] != 0) goto LAB_00235478;
          if (((local_4c & 2) != 0) && (0xf5 < (byte)(bVar1 - 0x3a))) {
            return -2;
          }
          uVar2 = (uint32_t)table_00[lVar9];
        }
        if (uVar2 < 0x1000) {
          if (uVar2 <= variableTop) {
            uVar2 = nextPair(table_00,uVar6,uVar2,(UChar *)0x0,left,&leftIndex,&leftLength_local);
            if (uVar2 == 1) {
              return -2;
            }
            uVar3 = getPrimaries(variableTop,uVar2);
            goto LAB_0023536d;
          }
          uVar3 = uVar2 & 0xff8;
        }
        else {
          uVar3 = uVar2 & 0xfc00;
        }
      }
    }
LAB_00235478:
    for (; uVar4 == 0; uVar4 = getPrimaries(variableTop,uVar4)) {
      if (rightIndex == rightLength) {
        uVar4 = 2;
        break;
      }
      lVar11 = (long)rightIndex + 1;
      iVar10 = (int)lVar11;
      bVar1 = local_48[rightIndex];
      lVar9 = (long)(char)bVar1;
      uVar6 = (uint)bVar1;
      if (lVar9 < 0) {
        if ((((byte)(bVar1 + 0x3a) < 0xfc) || (iVar10 == rightLength)) ||
           (-0x41 < (char)local_48[lVar11])) {
          rightIndex = iVar10;
          uVar4 = lookupUTF8(table_00,(uint)bVar1,local_48,&rightIndex,rightLength);
        }
        else {
          rightIndex = rightIndex + 2;
          uVar6 = ((uint)bVar1 * 0x40 + (uint)local_48[lVar11]) - 0x3080;
          uVar4 = (uint32_t)local_38[uVar6];
          if (local_38[uVar6] != 0) break;
          uVar4 = (uint32_t)table_00[uVar6];
        }
      }
      else {
        uVar4 = (uint32_t)local_38[lVar9];
        rightIndex = iVar10;
        if (local_38[lVar9] != 0) break;
        if (((local_4c & 2) != 0) && (0xf5 < (byte)(bVar1 - 0x3a))) {
          return -2;
        }
        uVar4 = (uint32_t)table_00[lVar9];
      }
      if (0xfff < uVar4) {
        uVar4 = uVar4 & 0xfc00;
        break;
      }
      if (variableTop < uVar4) {
        uVar4 = uVar4 & 0xff8;
        break;
      }
      uVar4 = nextPair(table_00,uVar6,uVar4,(UChar *)0x0,local_48,&rightIndex,&rightLength);
      if (uVar4 == 1) {
        return -2;
      }
    }
    if (uVar3 != uVar4) {
      uVar6 = uVar3 & 0xffff;
      uVar7 = uVar4 & 0xffff;
      if (uVar6 != uVar7) goto LAB_00235b5d;
      if (uVar3 == 2) break;
      uVar3 = uVar3 >> 0x10;
      uVar4 = uVar4 >> 0x10;
      goto LAB_0023536d;
    }
    uVar4 = 0;
    bVar13 = uVar3 != 2;
    uVar3 = 0;
  } while (bVar13);
  if (0xfff < local_3c) {
    rightIndex = 0;
    leftIndex = 0;
    uVar4 = 0;
    uVar2 = 0;
LAB_002357a0:
    do {
      uVar12 = uVar2;
      if (uVar2 == 0) {
        if (leftIndex == leftLength_local) {
          uVar12 = 2;
        }
        else {
          lVar9 = (long)leftIndex + 1;
          iVar8 = (int32_t)lVar9;
          bVar1 = left[leftIndex];
          uVar3 = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            if (bVar1 < 0xc6) {
              leftIndex = leftIndex + 2;
              uVar2 = (uint32_t)table_00[(ulong)((uint)left[lVar9] + uVar3 * 0x40) - 0x3080];
            }
            else {
              leftIndex = iVar8;
              uVar2 = lookupUTF8Unsafe(table_00,uVar3,left,&leftIndex);
            }
          }
          else {
            uVar2 = (uint32_t)table_00[uVar3];
            leftIndex = iVar8;
          }
          if (uVar2 < 0x1000) {
            if (uVar2 <= variableTop) {
              uVar2 = nextPair(table_00,uVar3,uVar2,(UChar *)0x0,left,&leftIndex,&leftLength_local);
              uVar2 = getSecondaries(variableTop,uVar2);
              goto LAB_002357a0;
            }
            uVar12 = 0xc0;
          }
          else {
            uVar3 = uVar2 & 0x3e0;
            uVar12 = uVar3 * 0x10000 + 0x2000c0;
            if (uVar3 < 0x180) {
              uVar12 = uVar3 + 0x20;
            }
          }
        }
      }
      while (uVar4 == 0) {
        if (rightIndex == rightLength) {
          uVar4 = 2;
          break;
        }
        lVar9 = (long)rightIndex + 1;
        iVar8 = (int32_t)lVar9;
        bVar1 = local_48[rightIndex];
        uVar3 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          if (bVar1 < 0xc6) {
            rightIndex = rightIndex + 2;
            uVar4 = (uint32_t)table_00[(ulong)((uint)local_48[lVar9] + uVar3 * 0x40) - 0x3080];
          }
          else {
            rightIndex = iVar8;
            uVar4 = lookupUTF8Unsafe(table_00,uVar3,local_48,&rightIndex);
          }
        }
        else {
          uVar4 = (uint32_t)table_00[uVar3];
          rightIndex = iVar8;
        }
        if (0xfff < uVar4) {
          uVar3 = uVar4 & 0x3e0;
          uVar4 = uVar3 * 0x10000 + 0x2000c0;
          if (uVar3 < 0x180) {
            uVar4 = uVar3 + 0x20;
          }
          break;
        }
        if (variableTop < uVar4) {
          uVar4 = 0xc0;
          break;
        }
        uVar4 = nextPair(table_00,uVar3,uVar4,(UChar *)0x0,local_48,&rightIndex,&rightLength);
        uVar4 = getSecondaries(variableTop,uVar4);
      }
      if (uVar12 != uVar4) {
        uVar6 = uVar12 & 0xffff;
        uVar7 = uVar4 & 0xffff;
        if (uVar6 != uVar7) {
          if ((local_4c >> 0xb & 1) != 0) {
            return -2;
          }
          goto LAB_00235b5d;
        }
        if (uVar12 == 2) break;
        uVar2 = uVar12 >> 0x10;
        uVar4 = uVar4 >> 0x10;
        goto LAB_002357a0;
      }
      uVar4 = 0;
      uVar2 = 0;
    } while (uVar12 != 2);
  }
  if ((local_4c >> 10 & 1) != 0) {
    bVar13 = local_3c < 0x1000;
    rightIndex = 0;
    leftIndex = 0;
    uVar5 = 0;
    uVar3 = 0;
LAB_002359be:
    do {
      if (uVar3 == 0) {
        lVar9 = (long)leftIndex;
        if (leftIndex != leftLength_local) {
          leftIndex = leftIndex + 1;
          uVar3 = (uint)left[lVar9];
          if ((char)left[lVar9] < '\0') {
            uVar4 = lookupUTF8Unsafe(table_00,uVar3,left,&leftIndex);
          }
          else {
            uVar4 = (uint32_t)table_00[uVar3];
          }
          if (uVar4 < 0xc00) {
            uVar4 = nextPair(table_00,uVar3,uVar4,(UChar *)0x0,left,&leftIndex,&leftLength_local);
          }
          uVar3 = getCases(variableTop,bVar13,uVar4);
          goto LAB_002359be;
        }
        uVar3 = 2;
      }
      while (uVar5 == 0) {
        lVar9 = (long)rightIndex;
        if (rightIndex == rightLength) {
          uVar5 = 2;
          break;
        }
        rightIndex = rightIndex + 1;
        uVar6 = (uint)local_48[lVar9];
        if ((char)local_48[lVar9] < '\0') {
          uVar4 = lookupUTF8Unsafe(table_00,uVar6,local_48,&rightIndex);
        }
        else {
          uVar4 = (uint32_t)table_00[uVar6];
        }
        if (uVar4 < 0xc00) {
          uVar4 = nextPair(table_00,uVar6,uVar4,(UChar *)0x0,local_48,&rightIndex,&rightLength);
        }
        uVar5 = getCases(variableTop,bVar13,uVar4);
      }
      if (uVar3 != uVar5) {
        uVar6 = uVar3 & 0xffff;
        uVar7 = uVar5 & 0xffff;
        if (uVar6 != uVar7) {
          if ((local_4c >> 8 & 1) == 0) goto LAB_00235b5d;
          uVar3 = (uVar6 < uVar7) - 1;
          goto LAB_00235b63;
        }
        if (uVar3 == 2) break;
        uVar3 = uVar3 >> 0x10;
        uVar5 = uVar5 >> 0x10;
        goto LAB_002359be;
      }
      uVar5 = 0;
      bVar14 = uVar3 != 2;
      uVar3 = 0;
    } while (bVar14);
  }
  if (0x1fff < local_3c) {
    bVar13 = (local_4c & 0x600) == 0x200;
    rightIndex = 0;
    leftIndex = 0;
    uVar4 = 0;
    uVar3 = 0;
LAB_00235641:
    do {
      if (uVar3 == 0) {
        lVar9 = (long)leftIndex;
        if (leftIndex != leftLength_local) {
          leftIndex = leftIndex + 1;
          uVar3 = (uint)left[lVar9];
          if ((char)left[lVar9] < '\0') {
            uVar2 = lookupUTF8Unsafe(table_00,uVar3,left,&leftIndex);
          }
          else {
            uVar2 = (uint32_t)table_00[uVar3];
          }
          if (uVar2 < 0xc00) {
            uVar2 = nextPair(table_00,uVar3,uVar2,(UChar *)0x0,left,&leftIndex,&leftLength_local);
          }
          uVar3 = getTertiaries(variableTop,bVar13,uVar2);
          goto LAB_00235641;
        }
        uVar3 = 2;
      }
      for (; uVar4 == 0; uVar4 = getTertiaries(variableTop,bVar13,uVar4)) {
        lVar9 = (long)rightIndex;
        if (rightIndex == rightLength) {
          uVar4 = 2;
          break;
        }
        rightIndex = rightIndex + 1;
        uVar6 = (uint)local_48[lVar9];
        if ((char)local_48[lVar9] < '\0') {
          uVar4 = lookupUTF8Unsafe(table_00,uVar6,local_48,&rightIndex);
        }
        else {
          uVar4 = (uint32_t)table_00[uVar6];
        }
        if (uVar4 < 0xc00) {
          uVar4 = nextPair(table_00,uVar6,uVar4,(UChar *)0x0,local_48,&rightIndex,&rightLength);
        }
      }
      if (uVar3 != uVar4) {
        uVar6 = uVar3 & 0xffff;
        uVar7 = uVar4 & 0xffff;
        if (uVar6 != uVar7) {
          if ((local_4c & 0x700) == 0x300) {
            if (3 < uVar6) {
              uVar6 = uVar6 ^ 0x18;
            }
            if (3 < uVar7) {
              uVar7 = uVar7 ^ 0x18;
            }
          }
          goto LAB_00235b5d;
        }
        if (uVar3 == 2) break;
        uVar3 = uVar3 >> 0x10;
        uVar4 = uVar4 >> 0x10;
        goto LAB_00235641;
      }
      uVar4 = 0;
      bVar14 = uVar3 != 2;
      uVar3 = 0;
    } while (bVar14);
    if (0x2fff < local_3c) {
      rightIndex = 0;
      leftIndex = 0;
      uVar4 = 0;
      uVar3 = 0;
LAB_00235b82:
      do {
        if (uVar3 == 0) {
          lVar9 = (long)leftIndex;
          if (leftIndex != leftLength_local) {
            leftIndex = leftIndex + 1;
            uVar3 = (uint)left[lVar9];
            if ((char)left[lVar9] < '\0') {
              uVar2 = lookupUTF8Unsafe(table_00,uVar3,left,&leftIndex);
            }
            else {
              uVar2 = (uint32_t)table_00[uVar3];
            }
            if (uVar2 < 0xc00) {
              uVar2 = nextPair(table_00,uVar3,uVar2,(UChar *)0x0,left,&leftIndex,&leftLength_local);
            }
            uVar3 = getQuaternaries(variableTop,uVar2);
            goto LAB_00235b82;
          }
          uVar3 = 2;
        }
        for (; uVar4 == 0; uVar4 = getQuaternaries(variableTop,uVar4)) {
          lVar9 = (long)rightIndex;
          if (rightIndex == rightLength) {
            uVar4 = 2;
            break;
          }
          rightIndex = rightIndex + 1;
          uVar6 = (uint)local_48[lVar9];
          if ((char)local_48[lVar9] < '\0') {
            uVar4 = lookupUTF8Unsafe(table_00,uVar6,local_48,&rightIndex);
          }
          else {
            uVar4 = (uint32_t)table_00[uVar6];
          }
          if (uVar4 < 0xc00) {
            uVar4 = nextPair(table_00,uVar6,uVar4,(UChar *)0x0,local_48,&rightIndex,&rightLength);
          }
        }
        if (uVar3 == uVar4) {
          uVar4 = 0;
          bVar13 = uVar3 == 2;
          uVar3 = 0;
          if (bVar13) {
            return 0;
          }
        }
        else {
          uVar6 = uVar3 & 0xffff;
          uVar7 = uVar4 & 0xffff;
          if (uVar6 != (uVar4 & 0xffff)) {
LAB_00235b5d:
            uVar3 = -(uint)(uVar6 < uVar7);
LAB_00235b63:
            return uVar3 | 1;
          }
          if (uVar3 == 2) {
            return 0;
          }
          uVar3 = uVar3 >> 0x10;
          uVar4 = uVar4 >> 0x10;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

int32_t
CollationFastLatin::compareUTF8(const uint16_t *table, const uint16_t *primaries, int32_t options,
                                 const uint8_t *left, int32_t leftLength,
                                 const uint8_t *right, int32_t rightLength) {
    // Keep compareUTF16() and compareUTF8() in sync very closely!

    U_ASSERT((table[0] >> 8) == VERSION);
    table += (table[0] & 0xff);  // skip the header
    uint32_t variableTop = (uint32_t)options >> 16;  // see RuleBasedCollator::getFastLatinOptions()
    options &= 0xffff;  // needed for CollationSettings::getStrength() to work

    // Check for supported characters, fetch mini CEs, and compare primaries.
    int32_t leftIndex = 0, rightIndex = 0;
    /**
     * Single mini CE or a pair.
     * The current mini CE is in the lower 16 bits, the next one is in the upper 16 bits.
     * If there is only one, then it is in the lower bits, and the upper bits are 0.
     */
    uint32_t leftPair = 0, rightPair = 0;
    // Note: There is no need to assemble the code point.
    // We only need to look up the table entry for the character,
    // and nextPair() looks for whether c==0.
    for(;;) {
        // We fetch CEs until we get a non-ignorable primary or reach the end.
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            uint8_t t;
            if(c <= 0x7f) {
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                leftPair = table[c];
            } else if(c <= LATIN_MAX_UTF8_LEAD && 0xc2 <= c && leftIndex != leftLength &&
                    0x80 <= (t = left[leftIndex]) && t <= 0xbf) {
                ++leftIndex;
                c = ((c - 0xc2) << 6) + t;
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                leftPair = table[c];
            } else {
                leftPair = lookupUTF8(table, c, left, leftIndex, leftLength);
            }
            if(leftPair >= MIN_SHORT) {
                leftPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(leftPair > variableTop) {
                leftPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                if(leftPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                leftPair = getPrimaries(variableTop, leftPair);
            }
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            uint8_t t;
            if(c <= 0x7f) {
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                rightPair = table[c];
            } else if(c <= LATIN_MAX_UTF8_LEAD && 0xc2 <= c && rightIndex != rightLength &&
                    0x80 <= (t = right[rightIndex]) && t <= 0xbf) {
                ++rightIndex;
                c = ((c - 0xc2) << 6) + t;
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                rightPair = table[c];
            } else {
                rightPair = lookupUTF8(table, c, right, rightIndex, rightLength);
            }
            if(rightPair >= MIN_SHORT) {
                rightPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(rightPair > variableTop) {
                rightPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                if(rightPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                rightPair = getPrimaries(variableTop, rightPair);
            }
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftPrimary = leftPair & 0xffff;
        uint32_t rightPrimary = rightPair & 0xffff;
        if(leftPrimary != rightPrimary) {
            // Return the primary difference.
            return (leftPrimary < rightPrimary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    // In the following, we need to re-fetch each character because we did not buffer the CEs,
    // but we know that the string is well-formed and
    // only contains supported characters and mappings.

    // We might skip the secondary level but continue with the case level
    // which is turned on separately.
    if(CollationSettings::getStrength(options) >= UCOL_SECONDARY) {
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                if(c <= 0x7f) {
                    leftPair = table[c];
                } else if(c <= LATIN_MAX_UTF8_LEAD) {
                    leftPair = table[((c - 0xc2) << 6) + left[leftIndex++]];
                } else {
                    leftPair = lookupUTF8Unsafe(table, c, left, leftIndex);
                }
                if(leftPair >= MIN_SHORT) {
                    leftPair = getSecondariesFromOneShortCE(leftPair);
                    break;
                } else if(leftPair > variableTop) {
                    leftPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                    leftPair = getSecondaries(variableTop, leftPair);
                }
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                if(c <= 0x7f) {
                    rightPair = table[c];
                } else if(c <= LATIN_MAX_UTF8_LEAD) {
                    rightPair = table[((c - 0xc2) << 6) + right[rightIndex++]];
                } else {
                    rightPair = lookupUTF8Unsafe(table, c, right, rightIndex);
                }
                if(rightPair >= MIN_SHORT) {
                    rightPair = getSecondariesFromOneShortCE(rightPair);
                    break;
                } else if(rightPair > variableTop) {
                    rightPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                    rightPair = getSecondaries(variableTop, rightPair);
                }
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftSecondary = leftPair & 0xffff;
            uint32_t rightSecondary = rightPair & 0xffff;
            if(leftSecondary != rightSecondary) {
                if((options & CollationSettings::BACKWARD_SECONDARY) != 0) {
                    // Full support for backwards secondary requires backwards contraction matching
                    // and moving backwards between merge separators.
                    return BAIL_OUT_RESULT;
                }
                return (leftSecondary < rightSecondary) ? UCOL_LESS : UCOL_GREATER;
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }

    if((options & CollationSettings::CASE_LEVEL) != 0) {
        UBool strengthIsPrimary = CollationSettings::getStrength(options) == UCOL_PRIMARY;
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
                if(leftPair < MIN_LONG) {
                    leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                }
                leftPair = getCases(variableTop, strengthIsPrimary, leftPair);
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
                if(rightPair < MIN_LONG) {
                    rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                }
                rightPair = getCases(variableTop, strengthIsPrimary, rightPair);
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftCase = leftPair & 0xffff;
            uint32_t rightCase = rightPair & 0xffff;
            if(leftCase != rightCase) {
                if((options & CollationSettings::UPPER_FIRST) == 0) {
                    return (leftCase < rightCase) ? UCOL_LESS : UCOL_GREATER;
                } else {
                    return (leftCase < rightCase) ? UCOL_GREATER : UCOL_LESS;
                }
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }
    if(CollationSettings::getStrength(options) <= UCOL_SECONDARY) { return UCOL_EQUAL; }

    // Remove the case bits from the tertiary weight when caseLevel is on or caseFirst is off.
    UBool withCaseBits = CollationSettings::isTertiaryWithCaseBits(options);

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
            }
            leftPair = getTertiaries(variableTop, withCaseBits, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
            }
            rightPair = getTertiaries(variableTop, withCaseBits, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftTertiary = leftPair & 0xffff;
        uint32_t rightTertiary = rightPair & 0xffff;
        if(leftTertiary != rightTertiary) {
            if(CollationSettings::sortsTertiaryUpperCaseFirst(options)) {
                // Pass through EOS and MERGE_WEIGHT
                // and keep real tertiary weights larger than the MERGE_WEIGHT.
                // Tertiary CEs (secondary ignorables) are not supported in fast Latin.
                if(leftTertiary > MERGE_WEIGHT) {
                    leftTertiary ^= CASE_MASK;
                }
                if(rightTertiary > MERGE_WEIGHT) {
                    rightTertiary ^= CASE_MASK;
                }
            }
            return (leftTertiary < rightTertiary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    if(CollationSettings::getStrength(options) <= UCOL_TERTIARY) { return UCOL_EQUAL; }

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
            }
            leftPair = getQuaternaries(variableTop, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
            }
            rightPair = getQuaternaries(variableTop, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftQuaternary = leftPair & 0xffff;
        uint32_t rightQuaternary = rightPair & 0xffff;
        if(leftQuaternary != rightQuaternary) {
            return (leftQuaternary < rightQuaternary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    return UCOL_EQUAL;
}